

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

lws * lws_wsi_mqtt_adopt(lws *parent_wsi,lws *wsi)

{
  int iVar1;
  lws *wsi_local;
  lws *parent_wsi_local;
  
  if ((parent_wsi->mux).child_count + 1 < 9) {
    *(ulong *)&wsi->field_0x2dc =
         *(ulong *)&wsi->field_0x2dc & 0xff7fffffffffffff | 0x80000000000000;
    lws_wsi_mux_insert(wsi,parent_wsi,(wsi->mux).my_sid);
    iVar1 = lws_ensure_user_space(wsi);
    if (iVar1 == 0) {
      lws_mqtt_set_client_established(wsi);
      lws_callback_on_writable(wsi);
      parent_wsi_local = wsi;
    }
    else {
      (parent_wsi->mux).child_list = (wsi->mux).sibling_list;
      (parent_wsi->mux).child_count = (parent_wsi->mux).child_count - 1;
      if (wsi->user_space != (void *)0x0) {
        lws_realloc(wsi->user_space,0,"free");
        wsi->user_space = (void *)0x0;
      }
      (*wsi->protocol->callback)(wsi,LWS_CALLBACK_WSI_DESTROY,(void *)0x0,(void *)0x0,0);
      lws_realloc(wsi,0,"lws_free");
      parent_wsi_local = (lws *)0x0;
    }
  }
  else {
    _lws_log(1,"%s: reached concurrent stream limit\n","lws_wsi_mqtt_adopt");
    parent_wsi_local = (lws *)0x0;
  }
  return parent_wsi_local;
}

Assistant:

struct lws *
lws_wsi_mqtt_adopt(struct lws *parent_wsi, struct lws *wsi)
{
	/* no more children allowed by parent? */

	if (parent_wsi->mux.child_count + 1 > LWS_MQTT_MAX_CHILDREN) {
		lwsl_err("%s: reached concurrent stream limit\n", __func__);
		return NULL;
	}

#if defined(LWS_WITH_CLIENT)
	wsi->client_mux_substream = 1;
#endif

	lws_wsi_mux_insert(wsi, parent_wsi, wsi->mux.my_sid);

	if (lws_ensure_user_space(wsi))
		goto bail1;

	lws_mqtt_set_client_established(wsi);
	lws_callback_on_writable(wsi);

#if defined(LWS_WITH_SERVER_STATUS)
	wsi->vhost->conn_stats.mqtt_subs++;
#endif

	return wsi;

bail1:
	/* undo the insert */
	parent_wsi->mux.child_list = wsi->mux.sibling_list;
	parent_wsi->mux.child_count--;

	if (wsi->user_space)
		lws_free_set_NULL(wsi->user_space);

	wsi->protocol->callback(wsi, LWS_CALLBACK_WSI_DESTROY, NULL, NULL, 0);
	lws_free(wsi);

	return NULL;
}